

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

CNodeState * __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::State(PeerManagerImpl *this,NodeId pnode)

{
  _Base_ptr p_Var1;
  _Base_ptr *pp_Var2;
  CNodeState *pCVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  long in_FS_OFFSET;
  
  p_Var5 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  pp_Var2 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var5->_M_header;
  while (p_Var1 = *pp_Var2, p_Var1 != (_Base_ptr)0x0) {
    if (pnode <= *(long *)(p_Var1 + 1)) {
      p_Var4 = p_Var1;
    }
    pp_Var2 = &p_Var1->_M_left + (*(long *)(p_Var1 + 1) < pnode);
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var5) {
    pCVar3 = (CNodeState *)0x0;
  }
  else {
    pCVar3 = (CNodeState *)0x0;
    if (*(long *)(p_Var4 + 1) <= pnode) {
      pCVar3 = (CNodeState *)&p_Var4[1]._M_parent;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return pCVar3;
}

Assistant:

const CNodeState* PeerManagerImpl::State(NodeId pnode) const
{
    std::map<NodeId, CNodeState>::const_iterator it = m_node_states.find(pnode);
    if (it == m_node_states.end())
        return nullptr;
    return &it->second;
}